

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O0

void Dch_CollectSuper(Aig_Obj_t *pObj,int fUseMuxes,Vec_Ptr_t *vSuper)

{
  int iVar1;
  Vec_Ptr_t *vSuper_local;
  int fUseMuxes_local;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                  ,0xf5,"void Dch_CollectSuper(Aig_Obj_t *, int, Vec_Ptr_t *)");
  }
  iVar1 = Aig_ObjIsCi(pObj);
  if (iVar1 == 0) {
    Vec_PtrClear(vSuper);
    Dch_CollectSuper_rec(pObj,vSuper,1,fUseMuxes);
    return;
  }
  __assert_fail("!Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchCnf.c"
                ,0xf6,"void Dch_CollectSuper(Aig_Obj_t *, int, Vec_Ptr_t *)");
}

Assistant:

void Dch_CollectSuper( Aig_Obj_t * pObj, int fUseMuxes, Vec_Ptr_t * vSuper )
{
    assert( !Aig_IsComplement(pObj) );
    assert( !Aig_ObjIsCi(pObj) );
    Vec_PtrClear( vSuper );
    Dch_CollectSuper_rec( pObj, vSuper, 1, fUseMuxes );
}